

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

TestCaseGroup * vkt::SpirVAssembly::createMemoryAccessTests(TestContext *testCtx)

{
  char *pcVar1;
  long *plVar2;
  long lVar3;
  mapped_type *pmVar4;
  size_t sVar5;
  NameMemoryAccess *name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  key_type local_9d0;
  TestCaseGroup *local_9b0;
  key_type local_9a8;
  StringTemplate local_988;
  long local_960;
  string local_958;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  memoryAccess;
  RGBA colors [4];
  NameMemoryAccess tests [7];
  char constantsAndTypes [223];
  char function [1519];
  
  local_9b0 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(local_9b0,testCtx,"opmemoryaccess","Memory Semantics");
  colors[0].m_value = 0;
  colors[1].m_value = 0;
  colors[2].m_value = 0;
  colors[3].m_value = 0;
  memcpy(constantsAndTypes,
         "%c_a2f32_1         = OpConstantComposite %a2f32 %c_f32_1 %c_f32_1\n%fp_a2f32          = OpTypePointer Function %a2f32\n%stype             = OpTypeStruct  %v4f32 %a2f32 %f32\n%fp_stype          = OpTypePointer Function %stype\n"
         ,0xdf);
  memcpy(function,
         "%test_code         = OpFunction %v4f32 None %v4f32_function\n%param1            = OpFunctionParameter %v4f32\n%lbl               = OpLabel\n%v1                = OpVariable %fp_v4f32 Function\n%v2                = OpVariable %fp_a2f32 Function\n%v3                = OpVariable %fp_f32 Function\n%v                 = OpVariable %fp_stype Function\n%vv                = OpVariable %fp_stype Function\n%vvv               = OpVariable %fp_f32 Function\n                     OpStore %v1 %c_v4f32_1_1_1_1\n                     OpStore %v2 %c_a2f32_1\n                     OpStore %v3 %c_f32_1\n%p_v4f32          = OpAccessChain %fp_v4f32 %v %c_u32_0\n%p_a2f32          = OpAccessChain %fp_a2f32 %v %c_u32_1\n%p_f32            = OpAccessChain %fp_f32 %v %c_u32_2\n%v1_v             = OpLoad %v4f32 %v1 ${access_type}\n%v2_v             = OpLoad %a2f32 %v2 ${access_type}\n%v3_v             = OpLoad %f32 %v3 ${access_type}\n                    OpStore %p_v4f32 %v1_v ${access_type}\n                    OpStore %p_a2f32 %v2_v ${access_type}\n                    OpStore %p_f32 %v3_v ${access_type}\n                    OpCopyMemory %vv %v ${access_type}\n                    OpCopyMemory %vvv %p_f32 ${access_type}\n%p_f32_2          = OpAccessChain %fp_f32 %vv %c_u32_2\n%v_f32_2          = OpLoad %f32 %p_f32_2\n%v_f32_3          = OpLoad %f32 %vvv\n%ret1             = OpVectorTimesScalar %v4f32 %param1 %v_f32_2\n%ret2             = OpVectorTimesScalar %v4f32 %ret1 %v_f32_3\n                    OpReturnValue %ret2\n                    OpFunctionEnd\n"
         ,0x5ef);
  tests[0].name._M_dataplus._M_p = (pointer)&tests[0].name.field_2;
  name = tests;
  std::__cxx11::string::_M_construct<char_const*>((string *)name,"none","");
  tests[0].accessType._M_dataplus._M_p = (pointer)&tests[0].accessType.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tests[0].accessType,"");
  tests[1].name._M_dataplus._M_p = (pointer)&tests[1].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 1),"volatile","");
  tests[1].accessType._M_dataplus._M_p = (pointer)&tests[1].accessType.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tests[1].accessType,"Volatile","");
  tests[2].name._M_dataplus._M_p = (pointer)&tests[2].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 2),"aligned","");
  tests[2].accessType._M_dataplus._M_p = (pointer)&tests[2].accessType.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tests[2].accessType,"Aligned 1","");
  tests[3].name._M_dataplus._M_p = (pointer)&tests[3].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 3),"volatile_aligned","");
  tests[3].accessType._M_dataplus._M_p = (pointer)&tests[3].accessType.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[3].accessType,"Volatile|Aligned 1","");
  tests[4].name._M_dataplus._M_p = (pointer)&tests[4].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 4),"nontemporal_aligned","");
  tests[4].accessType._M_dataplus._M_p = (pointer)&tests[4].accessType.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[4].accessType,"Nontemporal|Aligned 1","");
  tests[5].name._M_dataplus._M_p = (pointer)&tests[5].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 5),"volatile_nontemporal","");
  tests[5].accessType._M_dataplus._M_p = (pointer)&tests[5].accessType.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[5].accessType,"Volatile|Nontemporal","");
  tests[6].name._M_dataplus._M_p = (pointer)&tests[6].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(tests + 6),"volatile_nontermporal_aligned","");
  tests[6].accessType._M_dataplus._M_p = (pointer)&tests[6].accessType.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[6].accessType,"Volatile|Nontemporal|Aligned 1","");
  getHalfColorsFullAlpha(&colors);
  lVar3 = 7;
  do {
    paVar6 = &local_9d0.field_2;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fragments._M_t._M_impl.super__Rb_tree_header._M_header;
    fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    memoryAccess._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    memoryAccess._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    memoryAccess._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &memoryAccess._M_t._M_impl.super__Rb_tree_header._M_header;
    memoryAccess._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_9d0._M_dataplus._M_p = (pointer)paVar6;
    local_960 = lVar3;
    fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fragments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    memoryAccess._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         memoryAccess._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,"access_type","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&memoryAccess,&local_9d0);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9d0._M_dataplus._M_p != paVar6) {
      operator_delete(local_9d0._M_dataplus._M_p,
                      CONCAT71(local_9d0.field_2._M_allocated_capacity._1_7_,
                               local_9d0.field_2._M_local_buf[0]) + 1);
    }
    local_9d0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,"pre_main","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&fragments,&local_9d0);
    pcVar1 = (char *)pmVar4->_M_string_length;
    strlen(constantsAndTypes);
    std::__cxx11::string::_M_replace((ulong)pmVar4,0,pcVar1,(ulong)constantsAndTypes);
    paVar6 = &local_9d0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9d0._M_dataplus._M_p != paVar6) {
      operator_delete(local_9d0._M_dataplus._M_p,
                      CONCAT71(local_9d0.field_2._M_allocated_capacity._1_7_,
                               local_9d0.field_2._M_local_buf[0]) + 1);
    }
    local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
    sVar5 = strlen(function);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_958,function,function + sVar5);
    tcu::StringTemplate::StringTemplate(&local_988,&local_958);
    tcu::StringTemplate::specialize(&local_9d0,&local_988,&memoryAccess);
    local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"testfun","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&fragments,&local_9a8);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_9d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
      operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9d0._M_dataplus._M_p != paVar6) {
      operator_delete(local_9d0._M_dataplus._M_p,
                      CONCAT71(local_9d0.field_2._M_allocated_capacity._1_7_,
                               local_9d0.field_2._M_local_buf[0]) + 1);
    }
    tcu::StringTemplate::~StringTemplate(&local_988);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_958._M_dataplus._M_p != &local_958.field_2) {
      operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
    }
    local_9d0._M_string_length = 0;
    local_9d0.field_2._M_local_buf[0] = '\0';
    local_988.m_template.field_2._M_allocated_capacity = 0;
    local_988.m_template._M_dataplus._M_p = (pointer)0x0;
    local_988.m_template._M_string_length = 0;
    local_9d0._M_dataplus._M_p = (pointer)paVar6;
    createTestsForAllStages
              (&name->name,&colors,&colors,&fragments,
               (vector<int,_std::allocator<int>_> *)&local_988,local_9b0,QP_TEST_RESULT_FAIL,
               &local_9d0);
    if (local_988.m_template._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_988.m_template._M_dataplus._M_p,
                      local_988.m_template.field_2._M_allocated_capacity -
                      (long)local_988.m_template._M_dataplus._M_p);
    }
    lVar3 = local_960;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9d0._M_dataplus._M_p != paVar6) {
      operator_delete(local_9d0._M_dataplus._M_p,
                      CONCAT71(local_9d0.field_2._M_allocated_capacity._1_7_,
                               local_9d0.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&memoryAccess._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&fragments._M_t);
    name = name + 1;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  lVar3 = -0x1c0;
  paVar6 = &tests[6].accessType.field_2;
  do {
    plVar2 = (long *)(((string *)(paVar6 + -1))->_M_dataplus)._M_p;
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar2) {
      operator_delete(plVar2,paVar6->_M_allocated_capacity + 1);
    }
    if (paVar6 + -2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)paVar6[-3]._M_allocated_capacity) {
      operator_delete((long *)paVar6[-3]._M_allocated_capacity,paVar6[-2]._M_allocated_capacity + 1)
      ;
    }
    paVar6 = paVar6 + -4;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0);
  return local_9b0;
}

Assistant:

tcu::TestCaseGroup* createMemoryAccessTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> memoryAccessTests (new tcu::TestCaseGroup(testCtx, "opmemoryaccess", "Memory Semantics"));
	RGBA							colors[4];

	const char						constantsAndTypes[]	 =
		"%c_a2f32_1         = OpConstantComposite %a2f32 %c_f32_1 %c_f32_1\n"
		"%fp_a2f32          = OpTypePointer Function %a2f32\n"
		"%stype             = OpTypeStruct  %v4f32 %a2f32 %f32\n"
		"%fp_stype          = OpTypePointer Function %stype\n";

	const char						function[]	 =
		"%test_code         = OpFunction %v4f32 None %v4f32_function\n"
		"%param1            = OpFunctionParameter %v4f32\n"
		"%lbl               = OpLabel\n"
		"%v1                = OpVariable %fp_v4f32 Function\n"
		"%v2                = OpVariable %fp_a2f32 Function\n"
		"%v3                = OpVariable %fp_f32 Function\n"
		"%v                 = OpVariable %fp_stype Function\n"
		"%vv                = OpVariable %fp_stype Function\n"
		"%vvv               = OpVariable %fp_f32 Function\n"

		"                     OpStore %v1 %c_v4f32_1_1_1_1\n"
		"                     OpStore %v2 %c_a2f32_1\n"
		"                     OpStore %v3 %c_f32_1\n"

		"%p_v4f32          = OpAccessChain %fp_v4f32 %v %c_u32_0\n"
		"%p_a2f32          = OpAccessChain %fp_a2f32 %v %c_u32_1\n"
		"%p_f32            = OpAccessChain %fp_f32 %v %c_u32_2\n"
		"%v1_v             = OpLoad %v4f32 %v1 ${access_type}\n"
		"%v2_v             = OpLoad %a2f32 %v2 ${access_type}\n"
		"%v3_v             = OpLoad %f32 %v3 ${access_type}\n"

		"                    OpStore %p_v4f32 %v1_v ${access_type}\n"
		"                    OpStore %p_a2f32 %v2_v ${access_type}\n"
		"                    OpStore %p_f32 %v3_v ${access_type}\n"

		"                    OpCopyMemory %vv %v ${access_type}\n"
		"                    OpCopyMemory %vvv %p_f32 ${access_type}\n"

		"%p_f32_2          = OpAccessChain %fp_f32 %vv %c_u32_2\n"
		"%v_f32_2          = OpLoad %f32 %p_f32_2\n"
		"%v_f32_3          = OpLoad %f32 %vvv\n"

		"%ret1             = OpVectorTimesScalar %v4f32 %param1 %v_f32_2\n"
		"%ret2             = OpVectorTimesScalar %v4f32 %ret1 %v_f32_3\n"
		"                    OpReturnValue %ret2\n"
		"                    OpFunctionEnd\n";

	struct NameMemoryAccess
	{
		string name;
		string accessType;
	};


	NameMemoryAccess tests[] =
	{
		{ "none", "" },
		{ "volatile", "Volatile" },
		{ "aligned",  "Aligned 1" },
		{ "volatile_aligned",  "Volatile|Aligned 1" },
		{ "nontemporal_aligned",  "Nontemporal|Aligned 1" },
		{ "volatile_nontemporal",  "Volatile|Nontemporal" },
		{ "volatile_nontermporal_aligned",  "Volatile|Nontemporal|Aligned 1" },
	};

	getHalfColorsFullAlpha(colors);

	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameMemoryAccess); ++testNdx)
	{
		map<string, string> fragments;
		map<string, string> memoryAccess;
		memoryAccess["access_type"] = tests[testNdx].accessType;

		fragments["pre_main"] = constantsAndTypes;
		fragments["testfun"] = tcu::StringTemplate(function).specialize(memoryAccess);
		createTestsForAllStages(tests[testNdx].name, colors, colors, fragments, memoryAccessTests.get());
	}
	return memoryAccessTests.release();
}